

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
_set_selector<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
          *other,true_type *param_2)

{
  Matrix<double,__1,_1,_0,__1,_1> local_30;
  true_type *local_20;
  true_type *param_2_local;
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
  *other_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_local;
  
  local_20 = param_2;
  param_2_local = (true_type *)other;
  other_local = (GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
                 *)this;
  DenseBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>_>
  ::eval((DenseBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
          *)&local_30);
  _set_noalias<Eigen::Matrix<double,_1,1,0,_1,1>>
            (this,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_30);
  Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void _set_selector(const OtherDerived& other, const internal::true_type&) { _set_noalias(other.eval()); }